

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

StreamIn * prvTidyBufferInput(TidyDocImpl *doc,TidyBuffer *buf,int encoding)

{
  StreamIn *pSVar1;
  
  pSVar1 = prvTidyinitStreamIn(doc,encoding);
  tidyInitInputBuffer(&pSVar1->source,buf);
  pSVar1->iotype = BufferIO;
  return pSVar1;
}

Assistant:

StreamIn* TY_(BufferInput)( TidyDocImpl* doc, TidyBuffer* buf, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    tidyInitInputBuffer( &in->source, buf );
    in->iotype = BufferIO;
    return in;
}